

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Array<wchar_t> * __thiscall
kj::PathPtr::forWin32Api(Array<wchar_t> *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  ArrayPtr<const_char> text;
  String local_58;
  EncodingResult<kj::Array<wchar_t>_> local_38;
  
  toWin32StringImpl(&local_58,this,absolute,true);
  pcVar3 = (char *)local_58.content.size_;
  if ((char *)local_58.content.size_ != (char *)0x0) {
    pcVar3 = local_58.content.ptr;
  }
  pcVar2 = (char *)0x0;
  if ((char *)local_58.content.size_ != (char *)0x0) {
    pcVar2 = (char *)(local_58.content.size_ + -1);
  }
  text.size_ = (size_t)pcVar2;
  text.ptr = pcVar3;
  encodeWideString(&local_38,text,true);
  sVar1 = local_58.content.size_;
  pcVar3 = local_58.content.ptr;
  __return_storage_ptr__->ptr = local_38.super_Array<wchar_t>.ptr;
  __return_storage_ptr__->size_ = local_38.super_Array<wchar_t>.size_;
  __return_storage_ptr__->disposer = local_38.super_Array<wchar_t>.disposer;
  local_38.super_Array<wchar_t>.ptr = (wchar_t *)0x0;
  local_38.super_Array<wchar_t>.size_ = 0;
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    (**(local_58.content.disposer)->_vptr_ArrayDisposer)
              (local_58.content.disposer,pcVar3,1,sVar1,sVar1,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Array<wchar_t> PathPtr::forWin32Api(bool absolute) const {
  return encodeWideString(toWin32StringImpl(absolute, true), true);
}